

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr_io.cpp
# Opt level: O3

int SaveEXR(float *rgb,int width,int height,char *outfilename)

{
  int iVar1;
  char *__dest;
  void *pvVar2;
  void *__ptr;
  undefined8 uVar3;
  size_type sVar4;
  size_type __new_size;
  int i;
  float *pfVar5;
  long lVar6;
  char *err;
  vector<float,_std::allocator<float>_> images [3];
  float *image_ptr [3];
  EXRHeader header;
  char *pcStack_10958;
  char *pcStack_10950;
  EXRImage EStack_10948;
  vector<float,_std::allocator<float>_> vStack_10928;
  vector<float,_std::allocator<float>_> vStack_10910;
  vector<float,_std::allocator<float>_> vStack_108f8;
  pointer pfStack_108d8;
  pointer pfStack_108d0;
  pointer pfStack_108c8;
  EXRHeader EStack_108c0;
  
  pcStack_10950 = outfilename;
  memset(&EStack_108c0,0,0x10890);
  EStack_10948.width = 0;
  EStack_10948.height = 0;
  EStack_10948.tiles = (EXRTile *)0x0;
  EStack_10948.images = (uchar **)0x0;
  EStack_10948.num_channels = 3;
  vStack_108f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_108f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_108f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_10910.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_10910.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_10928.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_10910.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_10928.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_10928.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __new_size = (size_type)(height * width);
  std::vector<float,_std::allocator<float>_>::resize(&vStack_10928,__new_size);
  std::vector<float,_std::allocator<float>_>::resize(&vStack_10910,__new_size);
  std::vector<float,_std::allocator<float>_>::resize(&vStack_108f8,__new_size);
  if (0 < height * width) {
    pfVar5 = rgb + 2;
    sVar4 = 0;
    do {
      vStack_10928.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start[sVar4] = pfVar5[-2];
      vStack_10910.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start[sVar4] = pfVar5[-1];
      vStack_108f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start[sVar4] = *pfVar5;
      sVar4 = sVar4 + 1;
      pfVar5 = pfVar5 + 3;
    } while (__new_size != sVar4);
  }
  if (vStack_108f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_finish !=
      vStack_108f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    pfStack_108d8 =
         vStack_108f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (vStack_10910.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vStack_10910.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pfStack_108d0 =
           vStack_10910.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      if (vStack_10928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          vStack_10928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start) {
        EStack_10948.images = (uchar **)&pfStack_108d8;
        pfStack_108c8 =
             vStack_10928.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
        EStack_10948.height = height;
        EStack_10948.width = width;
        __dest = (char *)malloc(0x330);
        strncpy(__dest,"B",0xff);
        lVar6 = 0;
        __dest[1] = '\0';
        strncpy(__dest + 0x110,"G",0xff);
        __dest[0x111] = '\0';
        strncpy(__dest + 0x220,"R",0xff);
        __dest[0x221] = '\0';
        pvVar2 = malloc(0xc);
        __ptr = malloc(0xc);
        do {
          *(undefined4 *)((long)pvVar2 + lVar6 * 4) = 2;
          *(undefined4 *)((long)__ptr + lVar6 * 4) = 1;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        pcStack_10958 = (char *)0x0;
        iVar1 = SaveEXRImageToFile(&EStack_10948,&EStack_108c0,outfilename,&pcStack_10958);
        if (iVar1 == 0) {
          github111116::ConsoleLogger::info<char[16],char_const*>
                    (&console,(char (*) [16])"Saved exr file ",&pcStack_10950);
          free(__dest);
          free(pvVar2);
          free(__ptr);
        }
        else {
          SaveEXR();
        }
        lVar6 = 0x48;
        do {
          pvVar2 = *(void **)((long)&EStack_10948.images + lVar6);
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2,*(long *)((long)&EStack_10948.num_channels + lVar6) -
                                   (long)pvVar2);
          }
          lVar6 = lVar6 + -0x18;
        } while (lVar6 != 0);
        return iVar1;
      }
    }
  }
  uVar3 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  lVar6 = 0x48;
  do {
    pvVar2 = *(void **)((long)&EStack_10948.images + lVar6);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&EStack_10948.num_channels + lVar6) - (long)pvVar2);
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != 0);
  _Unwind_Resume(uVar3);
}

Assistant:

int SaveEXR(const float* rgb, int width, int height, const char* outfilename) {

  EXRHeader header;
  InitEXRHeader(&header);

  EXRImage image;
  InitEXRImage(&image);

  image.num_channels = 3;

  std::vector<float> images[3];
  images[0].resize(width * height);
  images[1].resize(width * height);
  images[2].resize(width * height);

  // Split RGBRGBRGB... into R, G and B layer
  for (int i = 0; i < width * height; i++) {
    images[0][i] = rgb[3*i+0];
    images[1][i] = rgb[3*i+1];
    images[2][i] = rgb[3*i+2];
  }

  float* image_ptr[3];
  image_ptr[0] = &(images[2].at(0)); // B
  image_ptr[1] = &(images[1].at(0)); // G
  image_ptr[2] = &(images[0].at(0)); // R

  image.images = (unsigned char**)image_ptr;
  image.width = width;
  image.height = height;

  header.num_channels = 3;
  header.channels = (EXRChannelInfo *)malloc(sizeof(EXRChannelInfo) * header.num_channels);
  // Must be (A)BGR order, since most of EXR viewers expect this channel order.
  strncpy(header.channels[0].name, "B", 255); header.channels[0].name[strlen("B")] = '\0';
  strncpy(header.channels[1].name, "G", 255); header.channels[1].name[strlen("G")] = '\0';
  strncpy(header.channels[2].name, "R", 255); header.channels[2].name[strlen("R")] = '\0';

  header.pixel_types = (int *)malloc(sizeof(int) * header.num_channels);
  header.requested_pixel_types = (int *)malloc(sizeof(int) * header.num_channels);
  for (int i = 0; i < header.num_channels; i++) {
    header.pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT; // pixel type of input image
    header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_HALF; // pixel type of output image to be stored in .EXR
  }

  const char* err = NULL; // or nullptr in C++11 or later.
  int ret = SaveEXRImageToFile(&image, &header, outfilename, &err);
  if (ret != TINYEXR_SUCCESS) {
    fprintf(stderr, "Save EXR err: %s\n", err);
    // FreeEXRErrorMessage(err); // free's buffer for an error message
    return ret;
  }
  console.info("Saved exr file ", outfilename);

  // free(rgb);

  free(header.channels);
  free(header.pixel_types);
  free(header.requested_pixel_types);

  return TINYEXR_SUCCESS;
}